

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_ManBmcSupergateTest(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Aig_Man_t *vSuper;
  uint i;
  Aig_Man_t *p_00;
  
  vSuper = p;
  Abc_Print((int)p,"Supergates: ");
  for (i = 0; (int)i < p->nTruePos; i = i + 1) {
    Vec_PtrEntry(p->vCos,i);
    p_00 = p;
    vSuper = (Aig_Man_t *)Saig_ManBmcSupergate(p,i);
    uVar1 = *(int *)((long)&vSuper->pName + 4);
    uVar2 = Saig_ManBmcCountRefed(p_00,(Vec_Ptr_t *)vSuper);
    Abc_Print((int)p_00,"%d=%d(%d) ",(ulong)i,(ulong)uVar1,(ulong)uVar2);
    Vec_PtrFree((Vec_Ptr_t *)vSuper);
  }
  Abc_Print((int)vSuper,"\n");
  return;
}

Assistant:

void Saig_ManBmcSupergateTest( Aig_Man_t * p )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "Supergates: " );
    Saig_ManForEachPo( p, pObj, i )
    {
        vSuper = Saig_ManBmcSupergate( p, i );
        Abc_Print( 1, "%d=%d(%d) ", i, Vec_PtrSize(vSuper), Saig_ManBmcCountRefed(p, vSuper) );
        Vec_PtrFree( vSuper );
    }
    Abc_Print( 1, "\n" );
}